

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adbc.cpp
# Opt level: O1

AdbcStatusCode
duckdb_adbc::StatementBindStream(AdbcStatement *statement,ArrowArrayStream *values,AdbcError *error)

{
  void *pvVar1;
  _func_int_ArrowArrayStream_ptr_ArrowSchema_ptr *p_Var2;
  _func_int_ArrowArrayStream_ptr_ArrowArray_ptr *p_Var3;
  _func_void_ArrowArrayStream_ptr *p_Var4;
  string local_38;
  
  if (statement == (AdbcStatement *)0x0) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"Missing statement object","");
    SetError(error,&local_38);
  }
  else {
    pvVar1 = statement->private_data;
    if (pvVar1 == (void *)0x0) {
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,"Invalid statement object","");
      SetError(error,&local_38);
    }
    else {
      if (values != (ArrowArrayStream *)0x0) {
        if (*(code **)((long)pvVar1 + 0x40) != (code *)0x0) {
          (**(code **)((long)pvVar1 + 0x40))((undefined8 *)((long)pvVar1 + 0x28));
        }
        *(void **)((long)pvVar1 + 0x48) = values->private_data;
        p_Var2 = values->get_schema;
        p_Var3 = values->get_next;
        p_Var4 = values->release;
        *(_func_char_ptr_ArrowArrayStream_ptr **)((long)pvVar1 + 0x38) = values->get_last_error;
        *(_func_void_ArrowArrayStream_ptr **)((long)pvVar1 + 0x40) = p_Var4;
        *(undefined8 *)((long)pvVar1 + 0x28) = p_Var2;
        *(_func_int_ArrowArrayStream_ptr_ArrowArray_ptr **)((long)pvVar1 + 0x30) = p_Var3;
        values->release = (_func_void_ArrowArrayStream_ptr *)0x0;
        return '\0';
      }
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,"Missing values object","");
      SetError(error,&local_38);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return '\x05';
}

Assistant:

AdbcStatusCode StatementBindStream(struct AdbcStatement *statement, struct ArrowArrayStream *values,
                                   struct AdbcError *error) {
	if (!statement) {
		SetError(error, "Missing statement object");
		return ADBC_STATUS_INVALID_ARGUMENT;
	}
	if (!statement->private_data) {
		SetError(error, "Invalid statement object");
		return ADBC_STATUS_INVALID_ARGUMENT;
	}
	if (!values) {
		SetError(error, "Missing values object");
		return ADBC_STATUS_INVALID_ARGUMENT;
	}

	auto wrapper = static_cast<DuckDBAdbcStatementWrapper *>(statement->private_data);
	if (wrapper->ingestion_stream.release) {
		// Release any resources currently held by the ingestion stream before we overwrite it
		wrapper->ingestion_stream.release(&wrapper->ingestion_stream);
	}
	wrapper->ingestion_stream = *values;
	values->release = nullptr;
	return ADBC_STATUS_OK;
}